

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O2

void __thiscall
coro_io::multithread_context_pool::~multithread_context_pool(multithread_context_pool *this)

{
  stop(this);
  std::promise<void>::~promise(&this->promise_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->thds_);
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ~ExecutorWrapper(&this->executor_);
  std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::~unique_ptr
            (&this->work_);
  asio::execution_context::~execution_context((execution_context *)this);
  return;
}

Assistant:

~multithread_context_pool() { stop(); }